

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_linux.c
# Opt level: O0

void platform_deinit(void)

{
  HTTPAPIEX_Deinit();
  tlsio_openssl_deinit();
  return;
}

Assistant:

void platform_deinit(void)
{
#ifdef USE_HTTP
#ifndef DONT_USE_UPLOADTOBLOB
    HTTPAPIEX_Deinit();
#endif /* DONT_USE_UPLOADTOBLOB */
#endif /* USE_HTTP */

#ifdef USE_OPENSSL
    tlsio_openssl_deinit();
#elif USE_WOLFSSL
    tlsio_wolfssl_deinit();
#endif
}